

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void Centaurus::LDFARoutineEM64T<unsigned_char>::emit
               (X86Assembler *as,Label *rejectlabel,LookaheadDFA<unsigned_char> *ldfa,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_68;
  Label *local_50;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *local_48;
  anon_union_16_7_ed616b9d_for_Operand__0 local_40;
  
  local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (Label *)0x0;
  local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
  local_50 = rejectlabel;
  local_48 = exitlabels;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4b0),
             (Operand_ *)(asmjit::x86OpData + 0x4e0));
  if (0 < (int)((ulong)((long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                              super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
    iVar2 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_40,as);
      if (local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::_M_realloc_insert<asmjit::Label>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Label *)&local_40._any);
      }
      else {
        ((local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0] =
             local_40._packed[0];
        ((local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.field_2 =
             local_40._mem.field_2;
        local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar2 = iVar2 + 1;
      iVar1 = (int)((ulong)((long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).
                                  m_states.
                                  super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).
                                 m_states.
                                 super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(iVar2,iVar1 * -0x33333333) != iVar2 + iVar1 * 0x33333333 < 0);
  }
  if (0 < (int)((ulong)((long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                              super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
    lVar4 = 0;
    lVar3 = 0;
    lVar5 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
                (as,(long)&((local_68.
                             super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_Operand).
                           super_Operand_.field_0 + lVar3);
      emit_state(as,local_50,
                 (LDFAState<unsigned_char> *)
                 ((long)&(((ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                           super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                         )._vptr_NFABaseState + lVar4),&local_68,local_48);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      lVar4 = lVar4 + 0x50;
    } while (lVar5 < (int)((ulong)((long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>)
                                         .m_states.
                                         super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).
                                        m_states.
                                        super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x33333333);
  }
  if (local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LDFARoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const LookaheadDFA<TCHAR>& ldfa, std::vector<asmjit::Label>& exitlabels)
{
    std::vector<asmjit::Label> statelabels;

    as.mov(PEEK_REG, INPUT_REG);

    for (int i = 0; i < ldfa.get_state_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }
    for (int i = 0; i < ldfa.get_state_num(); i++)
    {
        as.bind(statelabels[i]);
        emit_state(as, rejectlabel, ldfa[i], statelabels, exitlabels);
    }
}